

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRProgram.cc
# Opt level: O1

ConstantValue<flow::util::Cidr,_(flow::LiteralType)6> * __thiscall
flow::IRProgram::get<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>,flow::util::Cidr>
          (IRProgram *this,
          vector<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
          *table,Cidr *literal)

{
  undefined8 uVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  bool bVar6;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  ConstantValue<flow::util::Cidr,_(flow::LiteralType)6> *this_00;
  long lVar8;
  long lVar9;
  pointer *__ptr;
  undefined8 *puVar10;
  Cidr *pCVar11;
  long lVar12;
  bool bVar13;
  byte bVar14;
  _Head_base<0UL,_flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_*,_false> local_88;
  undefined1 local_80 [80];
  _Head_base<0UL,_flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_*,_false> _Var7;
  
  bVar14 = 0;
  _Var7._M_head_impl =
       (ConstantValue<flow::util::Cidr,_(flow::LiteralType)6> *)
       (table->
       super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  lVar12 = (long)(table->
                 super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)_Var7._M_head_impl;
  bVar13 = lVar12 == 0;
  if (!bVar13) {
    puVar10 = (undefined8 *)
              ((long)(((table->
                       super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                     super___uniq_ptr_impl<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>
                     ._M_t + 0x48);
    pCVar11 = (Cidr *)local_80;
    for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
      uVar1 = *puVar10;
      (pCVar11->ipaddr_).family_ = (int)uVar1;
      (pCVar11->ipaddr_).cstr_[0] = (char)((ulong)uVar1 >> 0x20);
      (pCVar11->ipaddr_).cstr_[1] = (char)((ulong)uVar1 >> 0x28);
      (pCVar11->ipaddr_).cstr_[2] = (char)((ulong)uVar1 >> 0x30);
      (pCVar11->ipaddr_).cstr_[3] = (char)((ulong)uVar1 >> 0x38);
      puVar10 = puVar10 + 1;
      pCVar11 = (Cidr *)((pCVar11->ipaddr_).cstr_ + 4);
    }
    bVar6 = util::operator==((Cidr *)local_80,literal);
    _Var7._M_head_impl =
         (ConstantValue<flow::util::Cidr,_(flow::LiteralType)6> *)CONCAT71(extraout_var,bVar6);
    if (bVar6) {
      lVar8 = 0;
    }
    else {
      lVar8 = 0;
      do {
        bVar13 = (lVar12 >> 3) + -1 == lVar8;
        if (bVar13) goto LAB_0014fcb0;
        puVar10 = (undefined8 *)
                  ((long)(table->
                         super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[lVar8 + 1]._M_t.
                         super___uniq_ptr_impl<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>
                         ._M_t + 0x48);
        pCVar11 = (Cidr *)local_80;
        for (lVar9 = 10; lVar9 != 0; lVar9 = lVar9 + -1) {
          uVar1 = *puVar10;
          (pCVar11->ipaddr_).family_ = (int)uVar1;
          (pCVar11->ipaddr_).cstr_[0] = (char)((ulong)uVar1 >> 0x20);
          (pCVar11->ipaddr_).cstr_[1] = (char)((ulong)uVar1 >> 0x28);
          (pCVar11->ipaddr_).cstr_[2] = (char)((ulong)uVar1 >> 0x30);
          (pCVar11->ipaddr_).cstr_[3] = (char)((ulong)uVar1 >> 0x38);
          puVar10 = puVar10 + (ulong)bVar14 * -2 + 1;
          pCVar11 = (Cidr *)((long)pCVar11 + (ulong)bVar14 * -0x10 + 8);
        }
        bVar6 = util::operator==((Cidr *)local_80,literal);
        _Var7._M_head_impl =
             (ConstantValue<flow::util::Cidr,_(flow::LiteralType)6> *)
             CONCAT71(extraout_var_00,bVar6);
        lVar8 = lVar8 + 1;
      } while (!bVar6);
    }
    _Var7._M_head_impl =
         *(ConstantValue<flow::util::Cidr,_(flow::LiteralType)6> **)
          &(table->
           super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start[lVar8]._M_t.
           super___uniq_ptr_impl<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>
           ._M_t;
  }
LAB_0014fcb0:
  if (bVar13) {
    this_00 = (ConstantValue<flow::util::Cidr,_(flow::LiteralType)6> *)operator_new(0x98);
    local_80._8_8_ = 0;
    local_80[0x10] = '\0';
    local_80._0_8_ = local_80 + 0x10;
    Value::Value((Value *)this_00,Cidr,(string *)local_80);
    (this_00->super_Constant).super_Value._vptr_Value = (_func_int **)&PTR__Value_001b1238;
    pCVar11 = &this_00->value_;
    for (lVar12 = 10; lVar12 != 0; lVar12 = lVar12 + -1) {
      cVar2 = (literal->ipaddr_).cstr_[0];
      cVar3 = (literal->ipaddr_).cstr_[1];
      cVar4 = (literal->ipaddr_).cstr_[2];
      cVar5 = (literal->ipaddr_).cstr_[3];
      (pCVar11->ipaddr_).family_ = (literal->ipaddr_).family_;
      (pCVar11->ipaddr_).cstr_[0] = cVar2;
      (pCVar11->ipaddr_).cstr_[1] = cVar3;
      (pCVar11->ipaddr_).cstr_[2] = cVar4;
      (pCVar11->ipaddr_).cstr_[3] = cVar5;
      literal = (Cidr *)((long)literal + (ulong)bVar14 * -0x10 + 8);
      pCVar11 = (Cidr *)((long)pCVar11 + (ulong)bVar14 * -0x10 + 8);
    }
    local_88._M_head_impl = this_00;
    if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
      operator_delete((void *)local_80._0_8_,CONCAT71(local_80._17_7_,local_80[0x10]) + 1);
    }
    std::
    vector<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>,std::default_delete<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>>>,std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>,std::default_delete<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>>>>>
    ::
    emplace_back<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>,std::default_delete<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>>>>
              ((vector<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>,std::default_delete<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>>>,std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>,std::default_delete<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>>>>>
                *)table,(unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>
                         *)&local_88);
    if (local_88._M_head_impl != (ConstantValue<flow::util::Cidr,_(flow::LiteralType)6> *)0x0) {
      (*((local_88._M_head_impl)->super_Constant).super_Value._vptr_Value[1])();
    }
    _Var7._M_head_impl =
         (table->
         super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_*,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>
         .
         super__Head_base<0UL,_flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_*,_false>
         ._M_head_impl;
  }
  return _Var7._M_head_impl;
}

Assistant:

T* IRProgram::get(std::vector<std::unique_ptr<T>>& table, const U& literal) {
  for (size_t i = 0, e = table.size(); i != e; ++i)
    if (table[i]->get() == literal)
      return table[i].get();

  table.emplace_back(std::make_unique<T>(literal));
  return table.back().get();
}